

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

void __thiscall QMenu::setNoReplayFor(QMenu *this,QWidget *noReplayFor)

{
  QWeakPointer<QObject>::assign<QObject>
            ((QWeakPointer<QObject> *)(*(long *)&(this->super_QWidget).field_0x8 + 0x3d8),
             &noReplayFor->super_QObject);
  return;
}

Assistant:

void QMenu::setNoReplayFor(QWidget *noReplayFor)
{
    d_func()->noReplayFor = noReplayFor;
}